

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_lsd.cpp
# Opt level: O0

void msd_lsd<8u>(Cacheblock<8U> *cache,size_t N,size_t depth)

{
  size_t sVar1;
  size_t sVar2;
  byte *pbVar3;
  undefined8 *puVar4;
  long *plVar5;
  long *plVar6;
  reference pvVar7;
  ulong local_1060;
  size_t i_3;
  size_t cnt;
  size_t start;
  size_t i_2;
  size_t i_1;
  size_t bucketindex [256];
  Cacheblock<8U> *sorted;
  size_t i;
  size_t bucketsize [256];
  int byte;
  size_t depth_local;
  size_t N_local;
  Cacheblock<8U> *cache_local;
  
  if (N < 0x20) {
    insertion_sort<8u>(cache,(int)N,depth);
  }
  else {
    fill_cache<8u>(cache,N,depth);
    for (bucketsize[0xff]._4_4_ = 7; -1 < bucketsize[0xff]._4_4_;
        bucketsize[0xff]._4_4_ = bucketsize[0xff]._4_4_ + -1) {
      memset(&i,0,0x800);
      for (sorted = (Cacheblock<8U> *)0x0; sorted < N;
          sorted = (Cacheblock<8U> *)((sorted->chars)._M_elems + 1)) {
        pbVar3 = std::array<unsigned_char,_8UL>::operator[]
                           (&cache[(long)sorted].chars,(long)bucketsize[0xff]._4_4_);
        bucketsize[(ulong)*pbVar3 - 1] = bucketsize[(ulong)*pbVar3 - 1] + 1;
      }
      bucketindex[0xff] = (size_t)malloc(N << 4);
      for (i_2 = 1; i_2 < 0x100; i_2 = i_2 + 1) {
        bucketindex[i_2 - 1] = bucketindex[i_2 - 2] + bucketsize[i_2 - 2];
      }
      for (start = 0; sVar2 = bucketindex[0xff], start < N; start = start + 1) {
        pbVar3 = std::array<unsigned_char,_8UL>::operator[]
                           (&cache[start].chars,(long)bucketsize[0xff]._4_4_);
        sVar1 = bucketindex[(ulong)*pbVar3 - 1];
        bucketindex[(ulong)*pbVar3 - 1] = sVar1 + 1;
        puVar4 = (undefined8 *)(sVar2 + sVar1 * 0x10);
        *puVar4 = *(undefined8 *)cache[start].chars._M_elems;
        puVar4[1] = cache[start].ptr;
      }
      memcpy(cache,(void *)bucketindex[0xff],N << 4);
      free((void *)bucketindex[0xff]);
    }
    cnt = 0;
    i_3 = 1;
    for (local_1060 = 0; local_1060 < N - 1; local_1060 = local_1060 + 1) {
      plVar5 = (long *)std::array<unsigned_char,_8UL>::data(&cache[local_1060].chars);
      plVar6 = (long *)std::array<unsigned_char,_8UL>::data(&cache[local_1060 + 1].chars);
      if (*plVar5 == *plVar6) {
        i_3 = i_3 + 1;
      }
      else {
        if (1 < i_3) {
          pvVar7 = std::array<unsigned_char,_8UL>::operator[](&cache[cnt].chars,7);
          if (*pvVar7 != '\0') {
            msd_lsd<8u>(cache + cnt,i_3,depth + 8);
          }
        }
        i_3 = 1;
        cnt = local_1060 + 1;
      }
    }
    if (1 < i_3) {
      pvVar7 = std::array<unsigned_char,_8UL>::operator[](&cache[cnt].chars,7);
      if (*pvVar7 != '\0') {
        msd_lsd<8u>(cache + cnt,i_3,depth + 8);
      }
    }
  }
  return;
}

Assistant:

static void
msd_lsd(Cacheblock<CachedChars>* cache, size_t N, size_t depth)
{
	static_assert(CachedChars>=1, "CachedChars must be positive");
	if (N < 32) {
		insertion_sort(cache, N, depth);
		return;
	}
	fill_cache(cache, N, depth);
	for (int byte=CachedChars-1; byte >= 0; --byte) {
		size_t bucketsize[256] = {0};
		for (size_t i=0; i < N; ++i)
			++bucketsize[cache[i].chars[byte]];
		Cacheblock<CachedChars>* sorted = (Cacheblock<CachedChars>*)
			malloc(N*sizeof(Cacheblock<CachedChars>));
		size_t bucketindex[256];
		bucketindex[0] = 0;
		for (size_t i=1; i < 256; ++i)
			bucketindex[i] = bucketindex[i-1] + bucketsize[i-1];
		for (size_t i=0; i < N; ++i)
			memcpy(&sorted[bucketindex[cache[i].chars[byte]]++],
					cache+i,
					sizeof(Cacheblock<CachedChars>));
		memcpy(cache, sorted, N*sizeof(Cacheblock<CachedChars>));
		free(sorted);
	}
	size_t start=0, cnt=1;
	for (size_t i=0; i < N-1; ++i) {
		if (memcmp(cache[i].chars.data(), cache[i+1].chars.data(),
				CachedChars) == 0) {
			++cnt;
			continue;
		}
		if (cnt > 1 && cache[start].chars[CachedChars-1] != 0) {
			msd_lsd(cache+start, cnt, depth+CachedChars);
		}
		cnt = 1;
		start = i+1;
	}
	if (cnt > 1 && cache[start].chars[CachedChars-1] != 0) {
		msd_lsd(cache+start, cnt, depth+CachedChars);
	}
}